

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O1

double duckdb_jaro_winkler::detail::jaro_similarity<char_const*,char_const*>
                 (char *P_first,char *P_last,char *T_first,char *T_last,double score_cutoff)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  uint64_t uVar7;
  uint64_t *puVar8;
  unsigned_long *puVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  uint64_t T_flag;
  ulong uVar18;
  uint64_t uVar19;
  long lVar20;
  int64_t Transpositions;
  ulong uVar21;
  BitvectorHashmap *pBVar22;
  uint64_t P_flag;
  char *first;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar31;
  double dVar32;
  FlaggedCharsMultiword flagged;
  PatternMatchVector PM;
  ulong local_10d8;
  ulong *local_1098;
  ulong *puStack_1090;
  undefined8 local_1088;
  ulong *puStack_1080;
  ulong *local_1078;
  undefined8 uStack_1070;
  ulong local_1060;
  undefined1 local_1058 [16];
  long local_1040;
  ulong local_1038;
  PatternMatchVector local_1030;
  
  lVar4 = (long)T_last - (long)T_first;
  lVar11 = (long)P_last - (long)P_first;
  if (lVar11 == 0 || lVar4 == 0) {
    return 0.0;
  }
  lVar20 = lVar11;
  if (lVar4 < lVar11) {
    lVar20 = lVar4;
  }
  dVar31 = (double)lVar11;
  dVar32 = (double)lVar4;
  if (((double)lVar20 / dVar32 + (double)lVar20 / dVar31 + 1.0) / 3.0 < score_cutoff) {
    return 0.0;
  }
  if (lVar4 == 1 && lVar11 == 1) {
    if (*P_first == *T_first) {
      uVar29 = 0;
      uVar30 = 0x3ff00000;
    }
    else {
      uVar29 = 0;
      uVar30 = 0;
    }
    goto LAB_003c13f6;
  }
  if (lVar11 < lVar4) {
    lVar20 = lVar4 / 2 + -1;
    if (lVar4 / 2 + lVar11 + -1 < lVar4) {
      T_last = T_first + lVar20 + lVar11;
    }
  }
  else {
    lVar20 = lVar11 / 2 + -1;
    if (lVar11 / 2 + lVar4 + -1 < lVar11) {
      P_last = P_first + lVar20 + lVar4;
    }
  }
  lVar4 = (long)T_last - (long)T_first;
  if ((long)P_last - (long)P_first <= (long)T_last - (long)T_first) {
    lVar4 = (long)P_last - (long)P_first;
  }
  lVar16 = 0;
  lVar11 = lVar16;
  if (0 < lVar4) {
    do {
      lVar11 = lVar16;
      if (P_first[lVar16] != T_first[lVar16]) break;
      lVar16 = lVar16 + 1;
      lVar11 = lVar4;
    } while (lVar4 != lVar16);
  }
  first = P_first + lVar11;
  lVar4 = 0;
  uVar5 = (long)P_last - (long)first;
  local_1058._8_4_ = in_XMM0_Dc;
  local_1058._0_8_ = score_cutoff;
  local_1058._12_4_ = in_XMM0_Dd;
  dVar3 = score_cutoff;
  if ((uVar5 != 0) && (pcVar15 = T_first + lVar11, dVar3 = score_cutoff, T_last != pcVar15)) {
    uVar26 = (long)T_last - (long)pcVar15;
    if (((long)uVar5 < 0x41) && ((long)uVar26 < 0x41)) {
      uVar21 = 0;
      switchD_005700f1::default(&local_1030,0,0x1000);
      common::PatternMatchVector::insert<char_const*>(&local_1030,first,P_last);
      iVar14 = (int)lVar20;
      uVar5 = ~(-1L << ((char)lVar20 + 1U & 0x3f));
      if (0x3e < iVar14) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar13 = (long)iVar14;
      if ((long)uVar26 < (long)iVar14) {
        uVar13 = uVar26;
      }
      if ((long)uVar13 < 1) {
        uVar18 = 0;
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        uVar18 = 0;
        uVar21 = 0;
        do {
          uVar19 = (uint64_t)pcVar15[uVar21];
          if ((long)uVar19 < 0) {
            uVar19 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar19);
            puVar9 = &local_1030.m_map.m_map._M_elems[uVar19].value;
          }
          else {
            puVar9 = local_1030.m_extendedAscii._M_elems + uVar19;
          }
          uVar12 = ~uVar23 & *puVar9 & uVar5;
          uVar23 = -uVar12 & uVar12 | uVar23;
          uVar18 = uVar18 | (ulong)(uVar12 != 0) << ((byte)uVar21 & 0x3f);
          uVar5 = uVar5 * 2 + 1;
          uVar21 = uVar21 + 1;
        } while (uVar13 != uVar21);
      }
      if ((long)uVar21 < (long)uVar26) {
        do {
          uVar19 = (uint64_t)pcVar15[uVar21];
          if ((long)uVar19 < 0) {
            uVar19 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar19);
            puVar9 = &local_1030.m_map.m_map._M_elems[uVar19].value;
          }
          else {
            puVar9 = local_1030.m_extendedAscii._M_elems + uVar19;
          }
          uVar13 = ~uVar23 & *puVar9 & uVar5;
          uVar23 = uVar23 | -uVar13 & uVar13;
          uVar18 = uVar18 | (ulong)(uVar13 != 0) << ((byte)uVar21 & 0x3f);
          uVar5 = uVar5 * 2;
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)uVar26);
      }
      uVar5 = uVar23 - (uVar23 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      lVar11 = (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) + lVar11;
      if (lVar11 == 0) {
        bVar2 = false;
      }
      else {
        bVar2 = (double)local_1058._0_8_ <=
                ((double)lVar11 / dVar32 + (double)lVar11 / dVar31 + 0.0 + 1.0) / 3.0;
      }
      lVar4 = 0;
      if ((bVar2) && (uVar18 != 0)) {
        lVar4 = 0;
        do {
          lVar20 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          uVar19 = (uint64_t)pcVar15[lVar20];
          if ((long)uVar19 < 0) {
            uVar19 = common::BitvectorHashmap::lookup(&local_1030.m_map,uVar19);
            puVar9 = &local_1030.m_map.m_map._M_elems[uVar19].value;
          }
          else {
            puVar9 = local_1030.m_extendedAscii._M_elems + uVar19;
          }
          lVar4 = lVar4 + (ulong)((*puVar9 & -uVar23 & uVar23) == 0);
          uVar23 = uVar23 ^ -uVar23 & uVar23;
          uVar18 = uVar18 & uVar18 - 1;
        } while (uVar18 != 0);
      }
    }
    else {
      common::BlockPatternMatchVector::BlockPatternMatchVector<char_const*>
                ((BlockPatternMatchVector *)&local_1030,first,P_last);
      uVar21 = uVar26 + 0x3f;
      if (-1 < (long)uVar26) {
        uVar21 = uVar26;
      }
      local_1078 = (ulong *)0x0;
      uStack_1070 = 0;
      local_1088 = 0;
      puStack_1080 = (ulong *)0x0;
      local_1098 = (ulong *)0x0;
      puStack_1090 = (ulong *)0x0;
      duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&puStack_1080,
                 (((long)uVar21 >> 6) + 1) - (ulong)((uVar26 & 0x3f) == 0));
      uVar21 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar21 = uVar5;
      }
      duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1098,
                 (((long)uVar21 >> 6) + 1) - (ulong)((uVar5 & 0x3f) == 0));
      if (0 < (long)uVar26) {
        uVar21 = lVar20 + 1U;
        if ((long)uVar5 < (long)(lVar20 + 1U)) {
          uVar21 = uVar5;
        }
        uVar13 = 0xffffffffffffffff;
        local_10d8 = ~(-1L << ((byte)uVar21 & 0x3f));
        uVar18 = uVar21 + 0x3f;
        if (-1 < (long)uVar21) {
          uVar18 = uVar21;
        }
        lVar4 = ((long)uVar18 >> 6) + 1;
        uVar21 = 0;
        lVar16 = 0;
        do {
          bVar1 = pcVar15[uVar21];
          uVar23 = (ulong)bVar1;
          uVar18 = uVar21 >> 6;
          bVar10 = (byte)uVar21 & 0x3f;
          local_1038 = uVar21;
          if (lVar4 == 1) {
            if ((char)bVar1 < '\0') {
              pBVar22 = (BitvectorHashmap *)
                        (local_1030.m_map.m_map._M_elems[0].key + lVar16 * 0x800);
              uVar19 = common::BitvectorHashmap::lookup(pBVar22,(long)(char)bVar1);
              puVar8 = &(pBVar22->m_map)._M_elems[uVar19].value;
            }
            else {
              puVar8 = (uint64_t *)
                       (local_1030.m_map.m_map._M_elems[1].value +
                       (uVar23 * local_1030.m_map.m_map._M_elems[3].key + lVar16) * 8);
            }
            uVar21 = *puVar8 & uVar13 & local_10d8;
            uVar23 = ~local_1098[lVar16] & uVar21;
            local_1098[lVar16] = -uVar23 & uVar21 | local_1098[lVar16];
            puStack_1080[uVar18] = puStack_1080[uVar18] | (ulong)(uVar23 != 0) << bVar10;
          }
          else {
            lVar25 = lVar16;
            local_1060 = uVar23;
            if (uVar13 != 0) {
              if ((char)bVar1 < '\0') {
                pBVar22 = (BitvectorHashmap *)
                          (local_1030.m_map.m_map._M_elems[0].key + lVar16 * 0x800);
                uVar19 = common::BitvectorHashmap::lookup(pBVar22,(long)(char)bVar1);
                puVar8 = &(pBVar22->m_map)._M_elems[uVar19].value;
              }
              else {
                puVar8 = (uint64_t *)
                         (local_1030.m_map.m_map._M_elems[1].value +
                         (local_1030.m_map.m_map._M_elems[3].key * uVar23 + lVar16) * 8);
              }
              uVar21 = ~local_1098[lVar16] & *puVar8 & uVar13;
              if (uVar21 != 0) {
                local_1098[lVar16] = -uVar21 & uVar21 | local_1098[lVar16];
                puStack_1080[uVar18] = puStack_1080[uVar18] | 1L << bVar10;
                goto LAB_003c0e9c;
              }
              lVar25 = lVar16 + 1;
            }
            lVar24 = lVar16 + lVar4 + -1;
            uVar21 = local_1060;
            if (lVar25 < lVar24) {
              lVar17 = lVar25 * 8;
              lVar27 = lVar25 << 0xb;
              local_1040 = lVar4;
              do {
                uVar19 = local_1030.m_map.m_map._M_elems[0].key;
                if ((char)bVar1 < '\0') {
                  uVar7 = common::BitvectorHashmap::lookup
                                    ((BitvectorHashmap *)
                                     (local_1030.m_map.m_map._M_elems[0].key + lVar27),
                                     (long)(char)bVar1);
                  puVar6 = (ulong *)(uVar19 + uVar7 * 0x10 + lVar25 * 0x800 + 8);
                  lVar4 = local_1040;
                  uVar21 = local_1060;
                }
                else {
                  puVar6 = (ulong *)(local_1030.m_map.m_map._M_elems[1].value +
                                    lVar17 + local_1030.m_map.m_map._M_elems[3].key * uVar21 * 8);
                }
                uVar23 = ~*(ulong *)((long)local_1098 + lVar17) & *puVar6;
                if (uVar23 != 0) {
                  *(ulong *)((long)local_1098 + lVar17) =
                       *puVar6 & -uVar23 | *(ulong *)((long)local_1098 + lVar17);
                  puStack_1080[uVar18] = puStack_1080[uVar18] | 1L << bVar10;
                  goto LAB_003c0e9c;
                }
                lVar25 = lVar25 + 1;
                lVar17 = lVar17 + 8;
                lVar27 = lVar27 + 0x800;
              } while (lVar25 < lVar24);
            }
            if (local_10d8 != 0) {
              if ((char)uVar21 < '\0') {
                pBVar22 = (BitvectorHashmap *)
                          (local_1030.m_map.m_map._M_elems[0].key + lVar25 * 0x800);
                uVar19 = common::BitvectorHashmap::lookup(pBVar22,(long)(char)uVar21);
                puVar8 = &(pBVar22->m_map)._M_elems[uVar19].value;
              }
              else {
                puVar8 = (uint64_t *)
                         (local_1030.m_map.m_map._M_elems[1].value +
                         (uVar21 * local_1030.m_map.m_map._M_elems[3].key + lVar25) * 8);
              }
              uVar21 = ~local_1098[lVar25] & *puVar8 & local_10d8;
              local_1098[lVar25] = -uVar21 & uVar21 | local_1098[lVar25];
              puStack_1080[uVar18] = puStack_1080[uVar18] | (ulong)(uVar21 != 0) << bVar10;
            }
          }
LAB_003c0e9c:
          if ((long)(local_1038 + lVar20 + 1) < (long)uVar5) {
            lVar25 = local_10d8 * 2;
            bVar2 = (long)(local_1038 + lVar20 + 2) < (long)uVar5;
            bVar28 = (local_10d8 & 0x7fffffffffffffff) == 0x7fffffffffffffff;
            local_10d8 = 0;
            if (!bVar28 || !bVar2) {
              local_10d8 = lVar25 + 1;
            }
            lVar4 = lVar4 + (ulong)(bVar28 && bVar2);
          }
          if ((lVar20 <= (long)local_1038) && (uVar13 = uVar13 * 2, uVar13 == 0)) {
            lVar4 = lVar4 + -1;
            lVar16 = lVar16 + 1;
            uVar13 = 0xffffffffffffffff;
          }
          uVar21 = local_1038 + 1;
        } while (uVar21 != uVar26);
      }
      if ((ulong)((long)puStack_1090 - (long)local_1098) <
          (ulong)((long)local_1078 - (long)puStack_1080)) {
        if (local_1098 == puStack_1090) {
LAB_003c11e1:
          lVar20 = 0;
        }
        else {
          lVar20 = 0;
          puVar6 = local_1098;
          do {
            uVar5 = *puVar6 - (*puVar6 >> 1 & 0x5555555555555555);
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
            lVar20 = lVar20 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                              0x38);
            puVar6 = puVar6 + 1;
          } while (puVar6 != puStack_1090);
        }
      }
      else {
        if (puStack_1080 == local_1078) goto LAB_003c11e1;
        lVar20 = 0;
        puVar6 = puStack_1080;
        do {
          uVar5 = *puVar6 - (*puVar6 >> 1 & 0x5555555555555555);
          uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
          lVar20 = lVar20 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
          ;
          puVar6 = puVar6 + 1;
        } while (puVar6 != local_1078);
      }
      lVar11 = lVar11 + lVar20;
      if (lVar11 == 0) {
        bVar2 = false;
      }
      else {
        bVar2 = (double)local_1058._0_8_ <=
                ((double)lVar11 / dVar32 + (double)lVar11 / dVar31 + 0.0 + 1.0) / 3.0;
      }
      lVar4 = 0;
      if ((lVar20 != 0) && (bVar2)) {
        uVar26 = *local_1098;
        uVar5 = *puStack_1080;
        lVar4 = 0;
        lVar25 = 0;
        lVar16 = 0;
        do {
          while (uVar5 == 0) {
            pcVar15 = pcVar15 + 0x40;
            lVar24 = lVar16 + 1;
            lVar16 = lVar16 + 1;
            uVar5 = *(ulong *)((long)puStack_1080 + lVar24 * 8);
          }
          do {
            while (uVar26 == 0) {
              lVar24 = lVar25 + 1;
              lVar25 = lVar25 + 1;
              uVar26 = *(ulong *)((long)local_1098 + lVar24 * 8);
            }
            lVar24 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            uVar19 = (uint64_t)pcVar15[lVar24];
            if ((long)uVar19 < 0) {
              pBVar22 = (BitvectorHashmap *)
                        (local_1030.m_map.m_map._M_elems[0].key + lVar25 * 0x800);
              uVar19 = common::BitvectorHashmap::lookup(pBVar22,uVar19);
              puVar8 = &(pBVar22->m_map)._M_elems[uVar19].value;
            }
            else {
              puVar8 = (uint64_t *)
                       (local_1030.m_map.m_map._M_elems[1].value +
                       (uVar19 * local_1030.m_map.m_map._M_elems[3].key + lVar25) * 8);
            }
            lVar4 = lVar4 + (ulong)((*puVar8 & -uVar26 & uVar26) == 0);
            uVar26 = -uVar26 & uVar26 ^ uVar26;
            lVar20 = lVar20 + -1;
            uVar5 = uVar5 & uVar5 - 1;
          } while (uVar5 != 0);
          uVar5 = 0;
        } while (lVar20 != 0);
      }
      if (puStack_1080 != (ulong *)0x0) {
        operator_delete(puStack_1080);
      }
      if (local_1098 != (ulong *)0x0) {
        operator_delete(local_1098);
      }
      if ((void *)local_1030.m_map.m_map._M_elems[1].value != (void *)0x0) {
        operator_delete((void *)local_1030.m_map.m_map._M_elems[1].value);
      }
      if ((void *)local_1030.m_map.m_map._M_elems[0].key != (void *)0x0) {
        operator_delete((void *)local_1030.m_map.m_map._M_elems[0].key);
      }
    }
    dVar3 = (double)local_1058._0_8_;
    if (!bVar2) {
      return 0.0;
    }
  }
  local_1058._0_8_ = dVar3;
  dVar3 = (double)lVar11;
  dVar31 = ((dVar3 - (double)(lVar4 / 2)) / dVar3 + dVar3 / dVar32 + dVar3 / dVar31 + 0.0) / 3.0;
  uVar5 = -(ulong)((double)local_1058._0_8_ <= dVar31) & (ulong)dVar31;
  uVar29 = (undefined4)uVar5;
  uVar30 = (undefined4)(uVar5 >> 0x20);
LAB_003c13f6:
  return (double)CONCAT44(uVar30,uVar29);
}

Assistant:

double jaro_similarity(InputIt1 P_first, InputIt1 P_last, InputIt2 T_first, InputIt2 T_last,
                       double score_cutoff)
{
    int64_t P_len = std::distance(P_first, P_last);
    int64_t T_len = std::distance(T_first, T_last);

    /* filter out based on the length difference between the two strings */
    if (!jaro_length_filter(P_len, T_len, score_cutoff)) {
        return 0.0;
    }

    if (P_len == 1 && T_len == 1) {
        return static_cast<double>(P_first[0] == T_first[0]);
    }

    int64_t Bound = jaro_bounds(P_first, P_last, T_first, T_last);

    /* common prefix never includes Transpositions */
    int64_t CommonChars = common::remove_common_prefix(P_first, P_last, T_first, T_last);
    int64_t Transpositions = 0;
    int64_t P_view_len = std::distance(P_first, P_last);
    int64_t T_view_len = std::distance(T_first, T_last);

    if (!P_view_len || !T_view_len) {
        /* already has correct number of common chars and transpositions */
    }
    else if (P_view_len <= 64 && T_view_len <= 64) {
        common::PatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_word(PM, P_first, P_last, T_first, T_last, static_cast<int>(Bound));
        CommonChars += count_common_chars(flagged);

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_word(PM, T_first, T_last, flagged);
    }
    else {
        common::BlockPatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_block(PM, P_first, P_last, T_first, T_last, Bound);
        int64_t FlaggedChars = count_common_chars(flagged);
        CommonChars += FlaggedChars;

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_block(PM, T_first, T_last, flagged, FlaggedChars);
    }

    double Sim = jaro_calculate_similarity(P_len, T_len, CommonChars, Transpositions);
    return common::result_cutoff(Sim, score_cutoff);
}